

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  Type *pTVar4;
  int iVar5;
  LogFinisher local_11a;
  byte local_119;
  LogMessage local_118;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9a;
  byte local_99;
  LogMessage local_98;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  RepeatedPtrFieldBase *local_10;
  RepeatedPtrFieldBase *this_local;
  
  local_10 = this;
  pAVar2 = GetArena(this);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c1);
    local_49 = 1;
    pLVar3 = LogMessage::operator<<(&local_48,"CHECK failed: GetArena() == nullptr: ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,"ReleaseCleared() can only be used on a RepeatedPtrField not on ");
    pLVar3 = LogMessage::operator<<(pLVar3,"an arena.");
    LogFinisher::operator=(local_5d,pLVar3);
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage(&local_48);
  }
  pAVar2 = GetArena(this);
  local_99 = 0;
  if (pAVar2 != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c4);
    local_99 = 1;
    pLVar3 = LogMessage::operator<<(&local_98,"CHECK failed: GetArena() == nullptr: ");
    LogFinisher::operator=(&local_9a,pLVar3);
  }
  if ((local_99 & 1) != 0) {
    LogMessage::~LogMessage(&local_98);
  }
  local_d9 = 0;
  if (this->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c5);
    local_d9 = 1;
    pLVar3 = LogMessage::operator<<(&local_d8,"CHECK failed: rep_ != nullptr: ");
    LogFinisher::operator=(&local_da,pLVar3);
  }
  if ((local_d9 & 1) != 0) {
    LogMessage::~LogMessage(&local_d8);
  }
  local_119 = 0;
  if (this->rep_->allocated_size <= this->current_size_) {
    LogMessage::LogMessage
              (&local_118,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c6);
    local_119 = 1;
    pLVar3 = LogMessage::operator<<
                       (&local_118,"CHECK failed: (rep_->allocated_size) > (current_size_): ");
    LogFinisher::operator=(&local_11a,pLVar3);
  }
  if ((local_119 & 1) != 0) {
    LogMessage::~LogMessage(&local_118);
  }
  pRVar1 = this->rep_;
  iVar5 = this->rep_->allocated_size + -1;
  this->rep_->allocated_size = iVar5;
  pTVar4 = cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (pRVar1->elements[iVar5]);
  return pTVar4;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseCleared() {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ReleaseCleared() can only be used on a RepeatedPtrField not on "
      << "an arena.";
  GOOGLE_DCHECK(GetArena() == nullptr);
  GOOGLE_DCHECK(rep_ != nullptr);
  GOOGLE_DCHECK_GT(rep_->allocated_size, current_size_);
  return cast<TypeHandler>(rep_->elements[--rep_->allocated_size]);
}